

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.h
# Opt level: O0

void embree::TutorialData_Constructor(TutorialData *This)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = g_ispc_scene;
  uVar1 = g_dirlight_direction.field_0._8_8_;
  in_RDI[4] = g_dirlight_direction.field_0._0_8_;
  in_RDI[5] = uVar1;
  uVar1 = g_dirlight_intensity.field_0._8_8_;
  in_RDI[6] = g_dirlight_intensity.field_0._0_8_;
  in_RDI[7] = uVar1;
  uVar1 = g_ambient_intensity.field_0._8_8_;
  in_RDI[8] = g_ambient_intensity.field_0._0_8_;
  in_RDI[9] = uVar1;
  in_RDI[10] = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)(in_RDI + 0x16) = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x18] = 0x3f11eb853f4ccccd;
  in_RDI[0x19] = 0x3ea3d70a;
  in_RDI[0x1a] = 0x3df5c28f3dcccccd;
  in_RDI[0x1b] = 0x3da3d70a;
  local_58 = (float)in_RDI[0x18];
  fStack_54 = (float)((ulong)in_RDI[0x18] >> 0x20);
  fStack_50 = (float)in_RDI[0x19];
  fStack_4c = (float)((ulong)in_RDI[0x19] >> 0x20);
  in_RDI[0x1c] = CONCAT44(fStack_54 * 0.2,local_58 * 0.2);
  in_RDI[0x1d] = CONCAT44(fStack_4c * 0.2,fStack_50 * 0.2);
  local_78 = (float)in_RDI[0x18];
  fStack_74 = (float)((ulong)in_RDI[0x18] >> 0x20);
  fStack_70 = (float)in_RDI[0x19];
  fStack_6c = (float)((ulong)in_RDI[0x19] >> 0x20);
  in_RDI[0x1e] = CONCAT44(fStack_74 * 0.8,local_78 * 0.8);
  in_RDI[0x1f] = CONCAT44(fStack_6c * 0.8,fStack_70 * 0.8);
  return;
}

Assistant:

void TutorialData_Constructor(TutorialData* This)
{
  This->scene = nullptr;
  This->traversable = nullptr;
  This->ispc_scene = g_ispc_scene;
  This->dirlight_direction = Vec3fa(g_dirlight_direction);
  This->dirlight_intensity = Vec3fa(g_dirlight_intensity);
  This->ambient_intensity = Vec3fa(g_ambient_intensity);
  This->accu = nullptr;
  This->accu_width = 0;
  This->accu_height = 0;
  This->accu_count = 0;
  This->g_subdiv_mode = false;
  
  /* initialize last seen camera */
  This->accu_vx = Vec3fa(0.0f);
  This->accu_vy = Vec3fa(0.0f);
  This->accu_vz = Vec3fa(0.0f);
  This->accu_p  = Vec3fa(0.0f);

  /* initialize hair colors */
  This->hair_K  = Vec3fa(0.8f,0.57f,0.32f);
  This->hair_dK = Vec3fa(0.1f,0.12f,0.08f);
  This->hair_Kr = 0.2f*This->hair_K;    //!< reflectivity of hair
  This->hair_Kt = 0.8f*This->hair_K;    //!< transparency of hair
}